

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VectorsTests.cpp
# Opt level: O0

void __thiscall
VectorsTest_Int3OperatorOutput_Test::TestBody(VectorsTest_Int3OperatorOutput_Test *this)

{
  bool bVar1;
  AssertHelper *this_00;
  AssertionResult gtest_ar;
  ostringstream os;
  Vector3<int> *in_stack_fffffffffffffe08;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe10;
  undefined4 in_stack_fffffffffffffe18;
  undefined4 in_stack_fffffffffffffe1c;
  char *in_stack_fffffffffffffe20;
  undefined4 in_stack_fffffffffffffe28;
  int in_stack_fffffffffffffe2c;
  char *in_stack_fffffffffffffe30;
  Type in_stack_fffffffffffffe3c;
  AssertHelper *in_stack_fffffffffffffe40;
  AssertionResult local_1b0;
  Message *in_stack_fffffffffffffe68;
  AssertHelper *in_stack_fffffffffffffe70;
  ostringstream local_180 [384];
  
  std::__cxx11::ostringstream::ostringstream(local_180);
  pica::Vector3<int>::Vector3((Vector3<int> *)&stack0xfffffffffffffe74,2,-1,0);
  pica::operator<<((ostream *)in_stack_fffffffffffffe10,in_stack_fffffffffffffe08);
  std::__cxx11::ostringstream::str();
  testing::internal::EqHelper<false>::Compare<char[11],std::__cxx11::string>
            ((char *)CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28),
             in_stack_fffffffffffffe20,
             (char (*) [11])CONCAT44(in_stack_fffffffffffffe1c,in_stack_fffffffffffffe18),
             in_stack_fffffffffffffe10);
  std::__cxx11::string::~string((string *)&stack0xfffffffffffffe30);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_1b0);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffffe40);
    this_00 = (AssertHelper *)testing::AssertionResult::failure_message((AssertionResult *)0x1de89b)
    ;
    testing::internal::AssertHelper::AssertHelper
              (in_stack_fffffffffffffe40,in_stack_fffffffffffffe3c,in_stack_fffffffffffffe30,
               in_stack_fffffffffffffe2c,in_stack_fffffffffffffe20);
    testing::internal::AssertHelper::operator=(in_stack_fffffffffffffe70,in_stack_fffffffffffffe68);
    testing::internal::AssertHelper::~AssertHelper(this_00);
    testing::Message::~Message((Message *)0x1de8e9);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1de939);
  std::__cxx11::ostringstream::~ostringstream(local_180);
  return;
}

Assistant:

TEST(VectorsTest, Int3OperatorOutput)
{
    std::ostringstream os;
    os << Int3(2, -1, 0);
    ASSERT_EQ("(2, -1, 0)", os.str());
}